

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int AllocateInternalBuffers32b(VP8LDecoder *dec,int final_width)

{
  int iVar1;
  int iVar2;
  ulong nmemb;
  void *pvVar3;
  uint in_ESI;
  undefined4 *in_RDI;
  uint64_t total_num_pixels;
  uint64_t cache_pixels;
  uint64_t cache_top_pixels;
  uint64_t num_pixels;
  uint local_4;
  
  iVar1 = in_RDI[0x21];
  iVar2 = in_RDI[0x22];
  nmemb = (ulong)(in_ESI & 0xffff);
  pvVar3 = WebPSafeMalloc(nmemb,(long)(int)in_ESI * 0x10);
  *(void **)(in_RDI + 6) = pvVar3;
  if (*(long *)(in_RDI + 6) != 0) {
    *(ulong *)(in_RDI + 8) = *(long *)(in_RDI + 6) + (long)iVar1 * (long)iVar2 * 4 + nmemb * 4;
  }
  else {
    *(undefined8 *)(in_RDI + 8) = 0;
    *in_RDI = 1;
  }
  local_4 = (uint)(*(long *)(in_RDI + 6) != 0);
  return local_4;
}

Assistant:

static int AllocateInternalBuffers32b(VP8LDecoder* const dec, int final_width) {
  const uint64_t num_pixels = (uint64_t)dec->width_ * dec->height_;
  // Scratch buffer corresponding to top-prediction row for transforming the
  // first row in the row-blocks. Not needed for paletted alpha.
  const uint64_t cache_top_pixels = (uint16_t)final_width;
  // Scratch buffer for temporary BGRA storage. Not needed for paletted alpha.
  const uint64_t cache_pixels = (uint64_t)final_width * NUM_ARGB_CACHE_ROWS;
  const uint64_t total_num_pixels =
      num_pixels + cache_top_pixels + cache_pixels;

  assert(dec->width_ <= final_width);
  dec->pixels_ = (uint32_t*)WebPSafeMalloc(total_num_pixels, sizeof(uint32_t));
  if (dec->pixels_ == NULL) {
    dec->argb_cache_ = NULL;    // for soundness
    dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
    return 0;
  }
  dec->argb_cache_ = dec->pixels_ + num_pixels + cache_top_pixels;
  return 1;
}